

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> * __thiscall
kj::Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::operator=
          (Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *this,
          Maybe<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> *other)

{
  Disposer *pDVar1;
  RpcResponse *pRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  pDVar1 = (this->ptr).disposer;
  pRVar2 = (this->ptr).ptr;
  uVar3 = *(undefined4 *)((long)&(other->ptr).disposer + 4);
  uVar4 = *(undefined4 *)&(other->ptr).ptr;
  uVar5 = *(undefined4 *)((long)&(other->ptr).ptr + 4);
  *(undefined4 *)&(this->ptr).disposer = *(undefined4 *)&(other->ptr).disposer;
  *(undefined4 *)((long)&(this->ptr).disposer + 4) = uVar3;
  *(undefined4 *)&(this->ptr).ptr = uVar4;
  *(undefined4 *)((long)&(this->ptr).ptr + 4) = uVar5;
  (other->ptr).ptr = (RpcResponse *)0x0;
  if (pRVar2 != (RpcResponse *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,(pRVar2->super_ResponseHook)._vptr_ResponseHook[-2] +
                      (long)&(pRVar2->super_ResponseHook)._vptr_ResponseHook);
  }
  return this;
}

Assistant:

inline Maybe& operator=(Maybe&& other) { ptr = kj::mv(other.ptr); return *this; }